

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerCallDirect(Lowerer *this,Instr *instr)

{
  ushort callflags;
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  SymOpnd *pSVar4;
  StackSym *pSVar5;
  undefined4 *puVar6;
  Opnd *newSrc;
  Instr *pIVar7;
  
  pOVar3 = IR::Instr::UnlinkSrc2(instr);
  pSVar4 = IR::Opnd::AsSymOpnd(pOVar3);
  pSVar5 = Sym::AsStackSym(pSVar4->m_sym);
  pIVar7 = (pSVar5->field_5).m_instrDef;
  if (pIVar7->m_opcode != ArgOut_A_InlineSpecialized) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3002,"(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pOVar3 = IR::Instr::UnlinkSrc1(pIVar7);
  newSrc = IR::Instr::UnlinkSrc2(pIVar7);
  IR::Instr::SetSrc2(instr,newSrc);
  IR::Instr::Remove(pIVar7);
  if ((instr->field_0x38 & 0x10) != 0) {
    bVar2 = IR::Instr::HasLazyBailOut(instr);
    if (!bVar2) {
      pIVar7 = SplitBailOnImplicitCall(this,instr,instr->m_next,instr->m_next);
      LowerBailOnEqualOrNotEqual
                (this,pIVar7,(BranchInstr *)0x0,(LabelInstr *)0x0,(PropertySymOpnd *)0x0,false);
    }
  }
  callflags = 2;
  if (instr->m_dst == (Opnd *)0x0) {
    callflags = 0x10;
  }
  pIVar7 = GenerateDirectCall(this,instr,pOVar3,callflags);
  return pIVar7;
}

Assistant:

IR::Instr *
Lowerer::LowerCallDirect(IR::Instr * instr)
{
    IR::Opnd* linkOpnd = instr->UnlinkSrc2();
    StackSym *linkSym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
    IR::Instr* argInstr = linkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized);
    IR::Opnd* funcObj = argInstr->UnlinkSrc1();
    instr->SetSrc2(argInstr->UnlinkSrc2());
    argInstr->Remove();

    if (instr->HasBailOutInfo() && !instr->HasLazyBailOut())
    {
        IR::Instr * bailOutInstr = this->SplitBailOnImplicitCall(instr, instr->m_next, instr->m_next);
        this->LowerBailOnEqualOrNotEqual(bailOutInstr);
    }
    Js::CallFlags flags = instr->GetDst() ? Js::CallFlags_Value : Js::CallFlags_NotUsed;
    return this->GenerateDirectCall(instr, funcObj, (ushort)flags);
}